

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DNATrie.cpp
# Opt level: O1

void __thiscall DNANode::~DNANode(DNANode *this)

{
  DNANode *pDVar1;
  
  pDVar1 = this->childNodes[0];
  if (pDVar1 != (DNANode *)0x0) {
    ~DNANode(pDVar1);
    operator_delete(pDVar1,0x28);
  }
  pDVar1 = this->childNodes[1];
  if (pDVar1 != (DNANode *)0x0) {
    ~DNANode(pDVar1);
    operator_delete(pDVar1,0x28);
  }
  pDVar1 = this->childNodes[2];
  if (pDVar1 != (DNANode *)0x0) {
    ~DNANode(pDVar1);
    operator_delete(pDVar1,0x28);
  }
  pDVar1 = this->childNodes[3];
  if (pDVar1 != (DNANode *)0x0) {
    ~DNANode(pDVar1);
    operator_delete(pDVar1,0x28);
  }
  this->childNodes[2] = (DNANode *)0x0;
  this->childNodes[3] = (DNANode *)0x0;
  this->childNodes[0] = (DNANode *)0x0;
  this->childNodes[1] = (DNANode *)0x0;
  return;
}

Assistant:

DNANode::~DNANode()
{
    if(childNodes[0] != nullptr) delete childNodes[0];
    if(childNodes[1] != nullptr) delete childNodes[1];
    if(childNodes[2] != nullptr) delete childNodes[2];
    if(childNodes[3] != nullptr) delete childNodes[3];
    childNodes[0] = nullptr;
    childNodes[1] = nullptr;
    childNodes[2] = nullptr;
    childNodes[3] = nullptr;
}